

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Decode
          (Minefield_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  allocator<unsigned_char> *paVar1;
  byte bVar2;
  KBOOL KVar3;
  KUINT16 KVar4;
  KException *this_00;
  KDataStream *pKVar5;
  reference pvVar6;
  ulong __n;
  size_type sVar7;
  byte *pbVar8;
  int iVar9;
  byte local_2e0;
  Vector local_260;
  byte local_243;
  byte local_242;
  allocator<KDIS::DATA_TYPE::Vector> local_241;
  undefined1 local_240 [5];
  KUINT8 k;
  KUINT8 ui8LoopVerts;
  vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> vVerts;
  KUINT8 j_1;
  iterator iStack_220;
  KUINT8 ui8Loop;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_218;
  const_iterator citrVert;
  undefined1 local_208 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vNumVerts;
  undefined1 local_1e8 [2];
  KUINT8 ui8PaddingNeeded;
  KUINT8 ui8Tmp;
  KUINT16 ui16TtlVerts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vNumTripDet;
  undefined1 local_1c8 [5];
  KUINT8 i_1;
  KUINT8 ui8Pad;
  KUINT8 ui8PaddingNeeded2;
  uchar local_1b2;
  byte local_1b1;
  undefined1 local_1b0 [6];
  KUINT8 ui8Sdc;
  KUINT8 j;
  KUINT16 local_19a;
  undefined1 local_198 [6];
  KUINT16 t_5;
  KFLOAT32 local_188;
  KFLOAT32 local_184;
  KFLOAT32 t_4;
  KFLOAT32 t_3;
  KFLOAT32 local_164;
  KFLOAT32 local_160;
  KFLOAT32 t_2;
  KFLOAT32 t_1;
  KFLOAT32 t;
  undefined1 local_140 [8];
  Mine mn;
  unsigned_short local_58;
  undefined1 local_55;
  KUINT16 ui16Pad;
  KUINT8 ui8PaddingNeeded1;
  KUINT8 i;
  KUINT16 ui16SnsTyp;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Minefield_Data_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar4 = KDataStream::GetBufferSize(stream);
  iVar9 = 0;
  if ((local_19 & 1) != 0) {
    iVar9 = 0xc;
  }
  if (0x2b < (uint)KVar4 + iVar9) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vui16SensorTypes);
    std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::clear
              (&this->m_vMines);
    Minefield_Header::Decode(&this->super_Minefield_Header,pKStack_18,(bool)(local_19 & 1));
    pKVar5 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_ReqID);
    pKVar5 = KDataStream::operator>>(pKVar5,&(this->m_SeqNumUnion).m_ui16SeqNum);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8ReqID);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8PduSeqNum);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8NumPdus);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8NumMines);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8NumSensTyp);
    pKVar5 = KDataStream::operator>>(pKVar5,&this->m_ui8Padding1);
    pKVar5 = DATA_TYPE::operator>>(pKVar5,&(this->m_DataFilter).super_DataTypeBase);
    DATA_TYPE::operator>>(pKVar5,&(this->m_MineTyp).super_DataTypeBase);
    local_58 = 0;
    for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumSensTyp; mn._223_1_ = mn._223_1_ + '\x01')
    {
      KDataStream::operator>>(pKStack_18,&local_58);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->m_vui16SensorTypes,&local_58);
    }
    mn._222_1_ = this->m_ui8NumSensTyp % 2;
    if (mn._222_1_ != 0) {
      mn._220_2_ = 0;
      KDataStream::operator>>(pKStack_18,(unsigned_short *)&mn.field_0xdc);
    }
    for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01') {
      DATA_TYPE::Mine::Mine((Mine *)local_140);
      DATA_TYPE::Vector::Vector((Vector *)&t_1,pKStack_18);
      DATA_TYPE::Mine::SetLocation((Mine *)local_140,(Vector *)&t_1);
      DATA_TYPE::Vector::~Vector((Vector *)&t_1);
      std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::push_back
                (&this->m_vMines,(value_type *)local_140);
      DATA_TYPE::Mine::~Mine((Mine *)local_140);
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>(pKStack_18,(float *)&t_2);
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::Mine::SetGroundBurialDepthOffsetValue(pvVar6,t_2);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>(pKStack_18,(float *)&local_160);
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::Mine::SetWaterBurialDepthOffsetValue(pvVar6,local_160);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>(pKStack_18,(float *)&local_164);
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::Mine::SetSnowBurialDepthOffsetValue(pvVar6,local_164);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsMineOrientation(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::EulerAngles::EulerAngles((EulerAngles *)&t_4,pKStack_18);
        DATA_TYPE::Mine::SetMineOrientationValue(pvVar6,(EulerAngles *)&t_4);
        DATA_TYPE::EulerAngles::~EulerAngles((EulerAngles *)&t_4);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsThermalContrast(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>(pKStack_18,(float *)&local_184);
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::Mine::SetThermalContrastValue(pvVar6,local_184);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsReflectance(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>(pKStack_18,(float *)&local_188);
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::Mine::SetReflectanceValue(pvVar6,local_188);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::ClockTime::ClockTime((ClockTime *)local_198,pKStack_18);
        DATA_TYPE::Mine::SetMineEmplacementAgeValue(pvVar6,(ClockTime *)local_198);
        DATA_TYPE::ClockTime::~ClockTime((ClockTime *)local_198);
      }
    }
    for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01') {
      KDataStream::operator>>(pKStack_18,&local_19a);
      pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
               operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
      DATA_TYPE::Mine::SetID(pvVar6,local_19a);
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsFusing(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::MineFusing::MineFusing((MineFusing *)local_1b0,pKStack_18);
        DATA_TYPE::Mine::SetFusingValue(pvVar6,(MineFusing *)local_1b0);
        DATA_TYPE::MineFusing::~MineFusing((MineFusing *)local_1b0);
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        for (local_1b1 = 0; local_1b1 < this->m_ui8NumSensTyp; local_1b1 = local_1b1 + 1) {
          local_1b2 = '\0';
          KDataStream::operator>>(pKStack_18,&local_1b2);
          pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                   operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
          DATA_TYPE::Mine::AddScalarDetectionCoefficientValue(pvVar6,local_1b2);
        }
      }
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(&this->m_DataFilter);
    if (KVar3) {
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                 operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
        DATA_TYPE::MinePaintScheme::MinePaintScheme((MinePaintScheme *)local_1c8,pKStack_18);
        DATA_TYPE::Mine::SetPaintSchemeValue(pvVar6,(MinePaintScheme *)local_1c8);
        DATA_TYPE::MinePaintScheme::~MinePaintScheme((MinePaintScheme *)local_1c8);
      }
    }
    vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = calcPaddingPaintScheme(this);
    vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    for (vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
        vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ <
        vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_;
        vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ =
             vNumTripDet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_ + 1) {
      KDataStream::operator>>
                (pKStack_18,
                 (uchar *)((long)&vNumTripDet.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    }
    KVar3 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(&this->m_DataFilter);
    if (KVar3) {
      bVar2 = this->m_ui8NumMines;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,(ulong)bVar2,
                 paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
      vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        KDataStream::operator>>
                  (pKStack_18,
                   (uchar *)((long)&vNumVerts.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_2_ =
             vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_2_ +
             vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,
                   (value_type_conflict *)
                   ((long)&vNumVerts.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 3));
      }
      vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ =
           (byte)((int)(4 - (uint)this->m_ui8NumMines) % 4);
      for (mn._223_1_ = 0;
          (byte)mn._223_1_ <
          vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_; mn._223_1_ = mn._223_1_ + '\x01') {
        KDataStream::operator>>
                  (pKStack_18,
                   (uchar *)((long)&vNumTripDet.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      }
      __n = (ulong)vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_;
      paVar1 = (allocator<unsigned_char> *)((long)&citrVert._M_current + 7);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,__n,paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)((long)&citrVert._M_current + 7));
      for (mn._223_1_ = 0;
          (byte)mn._223_1_ <
          vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_2_; mn._223_1_ = mn._223_1_ + '\x01') {
        KDataStream::operator>>
                  (pKStack_18,
                   (uchar *)((long)&vNumVerts.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,
                   (value_type_conflict *)
                   ((long)&vNumVerts.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 3));
      }
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      if ((sVar7 & 3) == 0) {
        local_2e0 = 0;
      }
      else {
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
        local_2e0 = 4 - ((byte)sVar7 & 3);
      }
      vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = local_2e0;
      for (mn._223_1_ = 0;
          (byte)mn._223_1_ <
          vNumVerts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_; mn._223_1_ = mn._223_1_ + '\x01') {
        KDataStream::operator>>
                  (pKStack_18,
                   (uchar *)((long)&vNumTripDet.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      }
      iStack_220 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_218,&stack0xfffffffffffffde0);
      for (mn._223_1_ = 0; (byte)mn._223_1_ < this->m_ui8NumMines; mn._223_1_ = mn._223_1_ + '\x01')
      {
        pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,
                            (ulong)(byte)mn._223_1_);
        vVerts.super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = *pbVar8;
        for (vVerts.
             super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
            vVerts.
            super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ <
            vVerts.
            super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
            vVerts.
            super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
                 vVerts.
                 super__Vector_base<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ + 1) {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_218);
          bVar2 = *pbVar8;
          std::allocator<KDIS::DATA_TYPE::Vector>::allocator(&local_241);
          std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::vector
                    ((vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> *)
                     local_240,(ulong)bVar2,&local_241);
          std::allocator<KDIS::DATA_TYPE::Vector>::~allocator(&local_241);
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_218);
          local_242 = *pbVar8;
          for (local_243 = 0; local_243 < local_242; local_243 = local_243 + 1) {
            DATA_TYPE::Vector::Vector(&local_260,pKStack_18);
            std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
            push_back((vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> *)
                      local_240,&local_260);
            DATA_TYPE::Vector::~Vector(&local_260);
          }
          pvVar6 = std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::
                   operator[](&this->m_vMines,(ulong)(byte)mn._223_1_);
          DATA_TYPE::Mine::AddTripDetonationWire
                    (pvVar6,(vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>
                             *)local_240);
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&local_218);
          std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::~vector
                    ((vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> *)
                     local_240);
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8);
    }
    return;
  }
  local_55 = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_55 = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16SensorTypes.clear();
    m_vMines.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ReqID
           >> m_ui8PduSeqNum
           >> m_ui8NumPdus
           >> m_ui8NumMines
           >> m_ui8NumSensTyp
           >> m_ui8Padding1
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTyp;

    // Sensor Types
    KUINT16 ui16SnsTyp = 0;
    KUINT8 i = 0;
    for( i = 0; i < m_ui8NumSensTyp; ++i )
    {
        stream >> ui16SnsTyp;
        m_vui16SensorTypes.push_back( ui16SnsTyp );
    }

    // Padding?
    KUINT8 ui8PaddingNeeded1 = m_ui8NumSensTyp % 2;
    if( ui8PaddingNeeded1 )
    {
        KUINT16 ui16Pad = 0;
        stream >> ui16Pad;
    }

    /************************************************************************/
    /* Mines                                                                */
    /************************************************************************/

    // Create the mines and extract location from stream
    for( i = 0; i < m_ui8NumMines; ++i )
    {
        Mine mn;
        mn.SetLocation( Vector( stream ) );
        m_vMines.push_back( mn );
    }

    // The following are all dependent on the data filter( except ID ):
    if( m_DataFilter.IsGroundBurialDepthOffset() )  MINE_DECODE_NATIVE( KFLOAT32, SetGroundBurialDepthOffsetValue )
        if( m_DataFilter.IsWaterBurialDepthOffset() )   MINE_DECODE_NATIVE( KFLOAT32, SetWaterBurialDepthOffsetValue )
            if( m_DataFilter.IsSnowBurialDepthOffset() )    MINE_DECODE_NATIVE( KFLOAT32, SetSnowBurialDepthOffsetValue )
                if( m_DataFilter.IsMineOrientation() )          MINE_DECODE_CLASS( EulerAngles, SetMineOrientationValue )
                    if( m_DataFilter.IsThermalContrast() )          MINE_DECODE_NATIVE( KFLOAT32, SetThermalContrastValue )
                        if( m_DataFilter.IsReflectance() )              MINE_DECODE_NATIVE( KFLOAT32, SetReflectanceValue )
                            if( m_DataFilter.IsMineEmplacementAge() )       MINE_DECODE_CLASS( ClockTime, SetMineEmplacementAgeValue )
                                MINE_DECODE_NATIVE( KUINT16, SetID )
                                if( m_DataFilter.IsFusing() )                   MINE_DECODE_CLASS( MineFusing, SetFusingValue )

                                    if( m_DataFilter.IsScalarDetectionCoefficient() )
                                    {
                                        for( i = 0; i < m_ui8NumMines; ++i )
                                        {
                                            for( KUINT8 j = 0; j < m_ui8NumSensTyp; ++j )
                                            {
                                                KUINT8 ui8Sdc = 0;
                                                stream >> ui8Sdc;
                                                m_vMines[i].AddScalarDetectionCoefficientValue( ui8Sdc );
                                            }
                                        }
                                    }

    if( m_DataFilter.IsPaintScheme() ) MINE_DECODE_CLASS( MinePaintScheme, SetPaintSchemeValue )

    // Do we need to add padding?
    // Padding � 8{[4 � N(2 F(8) + M F(9) + F(10) + 2)] mod4} bits unused
    KUINT8 ui8PaddingNeeded2 = calcPaddingPaintScheme();
    KUINT8 ui8Pad = 0;
    for( KUINT8 i = 0; i < ui8PaddingNeeded2; ++i )
    {
        stream >> ui8Pad;
    }

    // Trip/Det wires
    if( m_DataFilter.IsTripDetonationWire() )
    {
        // Get the number of trip/det wires
        vector<KUINT8> vNumTripDet( m_ui8NumMines );
        KUINT16 ui16TtlVerts = 0;
        KUINT8 ui8Tmp = 0;
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            stream >> ui8Tmp;
            ui16TtlVerts += ui8Tmp;
            vNumTripDet.push_back( ui8Tmp );
        }

        // Do we need to extract any padding?
        KUINT8 ui8PaddingNeeded = ( 4 - m_ui8NumMines ) % 4;
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Number of vertices's.
        vector<KUINT8> vNumVerts( ui16TtlVerts );
        for( i = 0; i < ui16TtlVerts; ++i )
        {
            stream >> ui8Tmp;
            vNumVerts.push_back( ui8Tmp );
        }

        // More padding?
        ui8PaddingNeeded = ( vNumVerts.size() % 4 == 0 ? 0 : ( 4 - vNumVerts.size() % 4 ) );
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Extract all vertices's and place them into the correct mines.
        // For each mine
        vector<KUINT8>::const_iterator citrVert = vNumVerts.begin();
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            // For each wire in the mine
            KUINT8 ui8Loop = vNumTripDet[i];
            for( KUINT8 j = 0; j < ui8Loop; ++j )
            {
                // Get the vertices's.
                vector<Vector> vVerts( *citrVert );
                KUINT8 ui8LoopVerts = *citrVert;
                for( KUINT8 k = 0; k < ui8LoopVerts; ++k )
                {
                    vVerts.push_back( Vector( stream ) );
                }

                // Add the vertices's to the current mine.
                m_vMines[i].AddTripDetonationWire( vVerts );
                ++citrVert;
            }
        }
    }
}